

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
* __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
::operator=(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
            *this,InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
                  *other)

{
  undefined8 uVar1;
  Rep *pRVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Rep *pRVar7;
  ulong uVar8;
  undefined8 *puVar9;
  void *__s;
  Rep *pRVar10;
  ulong uVar11;
  undefined8 *puVar12;
  
  if (this != other) {
    uVar8 = (other->allocator_and_tag_).tag_.size_;
    if ((uVar8 & 1) == 0) {
      uVar3 = (this->allocator_and_tag_).tag_.size_;
      if ((uVar3 & 1) != 0) {
        clear(this);
        uVar3 = (this->allocator_and_tag_).tag_.size_;
        uVar8 = (other->allocator_and_tag_).tag_.size_;
      }
      uVar4 = uVar3 >> 1;
      uVar11 = uVar8 >> 1;
      if (uVar4 < uVar11) {
        uVar8 = uVar8 & 1;
        pRVar2 = *(Rep **)((long)&other->rep_ + 8);
        pRVar7 = pRVar2;
        if (uVar8 == 0) {
          pRVar7 = &other->rep_;
        }
        puVar9 = (undefined8 *)((long)pRVar7 + uVar4 * 0x10);
        pRVar10 = &this->rep_;
        if (1 < uVar3) {
          pRVar2 = pRVar10;
          if ((uVar3 & 1) != 0) {
            pRVar2 = *(Rep **)((long)&this->rep_ + 8);
          }
          memmove(pRVar2,pRVar7,uVar4 * 0x10);
          uVar11 = (other->allocator_and_tag_).tag_.size_;
          pRVar2 = *(Rep **)((long)&other->rep_ + 8);
          uVar3 = (this->allocator_and_tag_).tag_.size_;
          uVar8 = (ulong)((uint)uVar11 & 1);
          uVar11 = uVar11 >> 1;
          uVar4 = uVar3 >> 1;
        }
        if (uVar8 == 0) {
          pRVar2 = &other->rep_;
        }
        puVar12 = (undefined8 *)(uVar11 * 0x10 + (long)pRVar2);
        if (puVar9 != puVar12) {
          if ((uVar3 & 1) != 0) {
            pRVar10 = *(Rep **)((long)&this->rep_ + 8);
          }
          puVar5 = (undefined8 *)(uVar4 * 0x10 + (long)pRVar10);
          do {
            uVar1 = puVar9[1];
            *puVar5 = *puVar9;
            puVar5[1] = uVar1;
            puVar5 = puVar5 + 2;
            puVar9 = puVar9 + 2;
          } while (puVar9 != puVar12);
        }
      }
      else {
        uVar3 = uVar3 & 1;
        pRVar2 = *(Rep **)((long)&this->rep_ + 8);
        pRVar7 = pRVar2;
        if (uVar3 == 0) {
          pRVar7 = &this->rep_;
        }
        if (1 < uVar8) {
          if ((uVar8 & 1) == 0) {
            pRVar2 = &other->rep_;
          }
          else {
            pRVar2 = *(Rep **)((long)&other->rep_ + 8);
          }
          memmove(pRVar7,pRVar2,uVar11 * 0x10);
          uVar4 = (this->allocator_and_tag_).tag_.size_;
          pRVar2 = *(Rep **)((long)&this->rep_ + 8);
          uVar3 = (ulong)((uint)uVar4 & 1);
          uVar4 = uVar4 >> 1;
        }
        __s = (void *)((long)pRVar7 + uVar11 * 0x10);
        if (uVar3 == 0) {
          pRVar2 = &this->rep_;
        }
        pvVar6 = (void *)(uVar4 * 0x10 + (long)pRVar2);
        if (__s != pvVar6) {
          memset(__s,0xab,(long)pvVar6 - (long)__s);
        }
      }
      (this->allocator_and_tag_).tag_.size_ =
           (other->allocator_and_tag_).tag_.size_ & 0xfffffffffffffffe;
    }
    else {
      clear(this);
      (this->allocator_and_tag_).tag_.size_ = (other->allocator_and_tag_).tag_.size_ | 1;
      uVar1 = *(undefined8 *)((long)&other->rep_ + 8);
      *(undefined8 *)&this->rep_ = *(undefined8 *)&other->rep_;
      *(undefined8 *)((long)&this->rep_ + 8) = uVar1;
      (other->allocator_and_tag_).tag_.size_ = 0;
    }
  }
  return this;
}

Assistant:

InlinedVector& operator=(InlinedVector&& other) {
    if (ABSL_PREDICT_FALSE(this == &other)) return *this;

    if (other.allocated()) {
      clear();
      tag().set_allocated_size(other.size());
      init_allocation(other.allocation());
      other.tag() = Tag();
    } else {
      if (allocated()) clear();
      // Both are inlined now.
      if (size() < other.size()) {
        auto mid = std::make_move_iterator(other.begin() + size());
        std::copy(std::make_move_iterator(other.begin()), mid, begin());
        UninitializedCopy(mid, std::make_move_iterator(other.end()), end());
      } else {
        auto new_end = std::copy(std::make_move_iterator(other.begin()),
                                 std::make_move_iterator(other.end()), begin());
        Destroy(new_end, end());
      }
      tag().set_inline_size(other.size());
    }
    return *this;
  }